

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

int __thiscall obx::BoxTypeless::remove(BoxTypeless *this,char *__filename)

{
  obx_err err;
  undefined1 local_30 [8];
  OBX_id_array cIds;
  uint64_t result;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *ids_local;
  BoxTypeless *this_local;
  
  cIds.count = 0;
  _local_30 = internal::cIdArrayRef
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__filename);
  err = obx_box_remove_many(this->cBox_,local_30,&cIds.count);
  internal::checkErrOrThrow(err);
  return (int)cIds.count;
}

Assistant:

uint64_t BoxTypeless::remove(const std::vector<obx_id>& ids) {
    uint64_t result = 0;
    const OBX_id_array cIds = internal::cIdArrayRef(ids);
    internal::checkErrOrThrow(obx_box_remove_many(cBox_, &cIds, &result));
    return result;
}